

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_trie.c
# Opt level: O2

int ngram_model_trie_write_bin(ngram_model_t *base,char *path)

{
  uint uVar1;
  char *__s;
  int iVar2;
  FILE *__s_00;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  uint32 count;
  int32 is_pipe;
  uint local_34;
  
  __s_00 = (FILE *)fopen_comp(path,"wb",&is_pipe);
  if (__s_00 == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
            ,0x1a9,"Unable to open %s to write binary trie LM\n",path);
    iVar2 = -1;
  }
  else {
    fwrite("Trie Language Model",1,0x13,__s_00);
    fputc((int)(char)base->n,__s_00);
    for (uVar4 = 0; uVar4 < base->n; uVar4 = uVar4 + 1) {
      count = base->n_counts[uVar4];
      fwrite(&count,4,1,__s_00);
    }
    lm_trie_write_bin(*(lm_trie_t **)(base + 1),*base->n_counts,(FILE *)__s_00);
    uVar1 = *base->n_counts;
    uVar5 = 0;
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      sVar3 = strlen(base->word_str[uVar4]);
      uVar5 = uVar5 + (int)sVar3 + 1;
    }
    local_34 = uVar5;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
            ,0x199,"#word_str: %d\n",(ulong)uVar5);
    fwrite(&local_34,4,1,__s_00);
    for (uVar4 = 0; uVar4 < *base->n_counts; uVar4 = uVar4 + 1) {
      __s = base->word_str[uVar4];
      sVar3 = strlen(__s);
      fwrite(__s,1,sVar3 + 1,__s_00);
    }
    fclose_comp((FILE *)__s_00,is_pipe);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
ngram_model_trie_write_bin(ngram_model_t * base, const char *path)
{
    int i;
    int32 is_pipe;
    ngram_model_trie_t *model = (ngram_model_trie_t *) base;
    FILE *fp = fopen_comp(path, "wb", &is_pipe);
    if (!fp) {
        E_ERROR("Unable to open %s to write binary trie LM\n", path);
        return -1;
    }

    fwrite(trie_hdr, sizeof(*trie_hdr), strlen(trie_hdr), fp);
    fwrite(&model->base.n, sizeof(model->base.n), 1, fp);
    for (i = 0; i < model->base.n; i++) {
        uint32 count = model->base.n_counts[i];
        if (SWAP_LM_TRIE)
            SWAP_INT32(&count);
        fwrite(&count, sizeof(count), 1, fp);
    }
    lm_trie_write_bin(model->trie, base->n_counts[0], fp);
    write_word_str(fp, base, SWAP_LM_TRIE);
    fclose_comp(fp, is_pipe);
    return 0;
}